

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_config.c
# Opt level: O2

int mk_config_listen_parse(char *value,mk_server *server)

{
  mk_list *pmVar1;
  uint uVar2;
  int iVar3;
  mk_list *list;
  char *pcVar4;
  int *piVar5;
  long lVar6;
  char *format;
  int iVar7;
  mk_list *__s;
  mk_list *pmVar8;
  char *local_38;
  
  list = mk_string_split_line(value);
  if (list == (mk_list *)0x0) {
    return -1;
  }
  pmVar1 = list->next;
  if (pmVar1 == list) goto LAB_00107b60;
  __s = pmVar1[-1].prev;
  uVar2 = (uint)__s;
  if (*(char *)&__s->prev == '[') {
    pcVar4 = strchr((char *)__s,0x5d);
    if (pcVar4 == (char *)0x0) {
      format = "[config] Expected closing \']\' in IPv6 address.";
    }
    else {
      format = "[config] Expected \':port\' after IPv6 address.";
      if ((pcVar4[1] == ':') && (pcVar4[2] != '\0')) {
        pmVar8 = (mk_list *)(pcVar4 + 2);
        __s = (mk_list *)((long)&__s->prev + 1);
        iVar7 = ~uVar2 + (int)pcVar4;
LAB_00107b38:
        local_38 = mk_string_copy_substr((char *)__s,0,iVar7);
        __s = pmVar8;
LAB_00107b75:
        pcVar4 = mk_string_dup((char *)__s);
        piVar5 = __errno_location();
        *piVar5 = 0;
        lVar6 = strtol(pcVar4,(char **)0x0,10);
        if ((*piVar5 != 0) || (lVar6 + 0x8000000000000001U < 2)) {
          pcVar4 = (char *)0x0;
          mk_print(0x1002,"Using defaults, could not understand \"Listen %s\"",pmVar1[-1].prev);
        }
        iVar7 = mk_config_key_have(list,"!http");
        iVar3 = mk_config_key_have(list,"tls");
        mk_config_listener_add
                  (local_38,pcVar4,(uint)(iVar3 != 0) << 3 | -(uint)(iVar7 != 0) | 1,server);
        mk_string_split_free(list);
        free(local_38);
        free(pcVar4);
        return 0;
      }
    }
  }
  else {
    pcVar4 = strchr((char *)__s,0x3a);
    if (pcVar4 == (char *)0x0) {
      local_38 = (char *)0x0;
      goto LAB_00107b75;
    }
    pcVar4 = strrchr((char *)__s,0x3a);
    format = "[config] Expected \':port\' after IPv4 address.";
    if ((pcVar4 != (char *)0x0) && (pcVar4[1] != '\0')) {
      pmVar8 = (mk_list *)(pcVar4 + 1);
      iVar7 = (int)pcVar4 - uVar2;
      goto LAB_00107b38;
    }
  }
  mk_print(0x1001,format);
LAB_00107b60:
  mk_string_split_free(list);
  return -1;
}

Assistant:

int mk_config_listen_parse(char *value, struct mk_server *server)
{
    int ret = -1;
    int flags = 0;
    long port_num;
    char *address = NULL;
    char *port = NULL;
    char *divider;
    struct mk_list *list = NULL;
    struct mk_string_line *listener;

    list = mk_string_split_line(value);
    if (!list) {
        goto error;
    }

    if (mk_list_is_empty(list) == 0) {
        goto error;
    }

    /* Parse the listener interface */
    listener = mk_list_entry_first(list, struct mk_string_line, _head);
    if (listener->val[0] == '[') {
        /* IPv6 address */
        divider = strchr(listener->val, ']');
        if (divider == NULL) {
            mk_err("[config] Expected closing ']' in IPv6 address.");
            goto error;
        }
        if (divider[1] != ':' || divider[2] == '\0') {
            mk_err("[config] Expected ':port' after IPv6 address.");
            goto error;
        }

        address = mk_string_copy_substr(listener->val + 1, 0,
                                        divider - listener->val - 1);
        port = mk_string_dup(divider + 2);
    }
    else if (strchr(listener->val, ':') != NULL) {
        /* IPv4 address */
        divider = strrchr(listener->val, ':');
        if (divider == NULL || divider[1] == '\0') {
            mk_err("[config] Expected ':port' after IPv4 address.");
            goto error;
        }

        address = mk_string_copy_substr(listener->val, 0,
                                        divider - listener->val);
        port = mk_string_dup(divider + 1);
    }
    else {
        /* Port only */
        address = NULL;
        port = mk_string_dup(listener->val);
    }

    errno = 0;
    port_num = strtol(port, NULL, 10);
    if (errno != 0 || port_num == LONG_MAX || port_num == LONG_MIN) {
        mk_warn("Using defaults, could not understand \"Listen %s\"",
                listener->val);
        port = NULL;
    }

    /* Check extra properties of the listener */
    flags = MK_CAP_HTTP;
    if (mk_config_key_have(list, "!http")) {
        flags |= ~MK_CAP_HTTP;
    }

#ifdef MK_HAVE_HTTP2
    if (mk_config_key_have(list, "h2")) {
        flags |= (MK_CAP_HTTP2 | MK_CAP_SOCK_TLS);
    }

    if (mk_config_key_have(list, "h2c")) {
        flags |= MK_CAP_HTTP2;
    }
#endif

    if (mk_config_key_have(list, "tls")) {
        flags |= MK_CAP_SOCK_TLS;
    }

    /* register the new listener */
    mk_config_listener_add(address, port, flags, server);
    mk_string_split_free(list);
    list = NULL;
    ret = 0;

error:
    if (address) {
        mk_mem_free(address);
    }
    if (port) {
        mk_mem_free(port);
    }
    if (list) {
        mk_string_split_free(list);
    }

    return ret;
}